

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine.hpp
# Opt level: O0

void __thiscall estl::state_machine<cdplayer>::state_machine(state_machine<cdplayer> *this)

{
  state_machine<cdplayer> *this_local;
  
  std::array<estl::state_machine<cdplayer>::switch_entry,_4UL>::array(&this->state_switches_);
  std::
  vector<estl::state_machine<cdplayer>::action_entry,_std::allocator<estl::state_machine<cdplayer>::action_entry>_>
  ::vector(&this->actions_);
  this->state_ = off;
  cdplayer::outputs_type::outputs_type(&this->outputs_);
  cdplayer::add_transitions((cdplayer *)this,this);
  cdplayer::add_actions((cdplayer *)this,this);
  return;
}

Assistant:

state_machine() {
        state_machine_.add_transitions(*this);
        state_machine_.add_actions(*this);
    }